

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::focusOutEvent(QAbstractSpinBox *this,QFocusEvent *event)

{
  QAbstractSpinBoxPrivate *pQVar1;
  undefined8 in_RSI;
  QAbstractSpinBoxPrivate *in_RDI;
  QAbstractSpinBoxPrivate *d;
  QFocusEvent *in_stack_ffffffffffffffd8;
  
  pQVar1 = d_func((QAbstractSpinBox *)0x689401);
  if ((*(ushort *)&pQVar1->field_0x3d0 & 1) != 0) {
    (**(code **)(*(long *)&pQVar1->super_QWidgetPrivate + 0xd0))(pQVar1,0);
  }
  QAbstractSpinBoxPrivate::reset(in_RDI);
  (**(code **)(*(long *)&pQVar1->edit->super_QWidget + 0x28))(pQVar1->edit,in_RSI);
  (**(code **)(*(long *)&pQVar1->super_QWidgetPrivate + 0xc0))();
  QWidget::focusOutEvent((QWidget *)in_RDI,in_stack_ffffffffffffffd8);
  editingFinished((QAbstractSpinBox *)0x689476);
  return;
}

Assistant:

void QAbstractSpinBox::focusOutEvent(QFocusEvent *event)
{
    Q_D(QAbstractSpinBox);

    if (d->pendingEmit)
        d->interpret(EmitIfChanged);

    d->reset();
    d->edit->event(event);
    d->updateEdit();
    QWidget::focusOutEvent(event);

#ifdef QT_KEYPAD_NAVIGATION
    // editingFinished() is already emitted on LeaveEditFocus
    if (!QApplicationPrivate::keypadNavigationEnabled())
#endif
    emit editingFinished();
}